

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_status.cpp
# Opt level: O2

void __thiscall libtorrent::torrent_status::~torrent_status(torrent_status *this)

{
  ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
             &this->verified_pieces);
  ::std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&this->pieces);
  ::std::__cxx11::string::~string((string *)&this->current_tracker);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->torrent_file).
              super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__cxx11::string::~string((string *)&this->name);
  ::std::__cxx11::string::~string((string *)&this->save_path);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->handle).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

torrent_status::~torrent_status() = default;